

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O1

char * lj_strfmt_wfnum(SBuf *sb,SFormat sf,lua_Number n,char *p)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint32_t uVar26;
  uint uVar27;
  char *__s;
  lua_Number lVar28;
  byte *pbVar29;
  byte *pbVar30;
  uint32_t *puVar31;
  char nd9 [9];
  char ref9 [9];
  uint32_t nd [64];
  ulong local_1d8;
  char *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  char local_1a0;
  uint local_198;
  int local_190;
  char local_179 [9];
  ulong local_170;
  lua_Number local_168;
  SBuf *local_160;
  uint local_154;
  ulong local_150;
  char local_141 [9];
  uint local_138 [31];
  uint local_bc;
  uint local_b8;
  uint local_b4 [33];
  
  uVar3 = sf >> 0x10 & 0xff;
  local_168 = n;
  uVar7 = (uint)((ulong)n >> 0x20);
  uVar24 = SUB84(n,0);
  if (0xffdfffff < uVar7 * 2) {
    uVar7 = (int)(sf << 0x12) >> 0x1f & 0x202020;
    if (uVar24 == 0 && ((ulong)n & 0xfffff00000000) == 0) {
      uVar7 = uVar7 ^ 0x696e66;
      uVar24 = 1;
      if ((long)n < 0) {
        cVar19 = '-';
      }
      else {
        cVar19 = '+';
        if ((sf >> 9 & 1) == 0) goto LAB_00119efe;
      }
    }
    else {
      uVar7 = uVar7 ^ 0x6e616e;
LAB_00119efe:
      uVar24 = (sf & 0x800) >> 0xb;
      cVar19 = (char)((sf & 0x800) >> 6);
    }
    local_1c8._0_4_ = uVar24 + 3;
    if (p == (char *)0x0) {
      uVar4 = (uint)local_1c8;
      if ((uint)local_1c8 < uVar3) {
        uVar4 = uVar3;
      }
      uVar15 = (sb->p).ptr32;
      p = (char *)(ulong)uVar15;
      if ((sb->e).ptr32 - uVar15 < uVar4) {
        p = lj_buf_more2(sb,uVar4);
      }
    }
    if ((sf >> 8 & 1) == 0) {
      if ((uint)local_1c8 < uVar3) {
        memset(p,0x20,(ulong)(uVar3 + ~(uint)local_1c8) + 1);
        p = p + (ulong)(uVar3 + ~(uint)local_1c8) + 1;
        uVar3 = uVar24 + 2;
      }
      else {
        uVar3 = uVar3 - 1;
      }
    }
    if ((char)uVar24 != '\0') {
      *p = cVar19;
      p = p + 1;
    }
    *p = (char)(uVar7 >> 0x10);
    p[1] = (char)(uVar7 >> 8);
    p[2] = (char)uVar7;
    local_1d0 = p + 3;
    goto LAB_0011ad6b;
  }
  uVar15 = (sf >> 0x18) - 1;
  uVar9 = (ulong)uVar15;
  uVar4 = sf >> 4 & 3;
  local_1c8 = (ulong)uVar4;
  if (uVar4 != 0) {
    local_190 = 1;
    local_160 = sb;
    if ((long)n < 0) {
      local_1a0 = '-';
LAB_00119a78:
      bVar2 = false;
    }
    else {
      bVar2 = false;
      if ((sf >> 9 & 1) == 0) {
        if ((sf >> 0xb & 1) != 0) {
          local_1a0 = ' ';
          goto LAB_00119a78;
        }
        bVar2 = true;
        local_1a0 = '\0';
        local_190 = 0;
      }
      else {
        local_1a0 = '+';
      }
    }
    uVar24 = uVar7 >> 0x14 & 0x7ff;
    local_154 = (sf >> 0x18) + 6;
    local_170 = uVar9;
    if (sf < 0x1000000) {
      uVar9 = (ulong)local_154;
    }
    uVar15 = (int)uVar9 - 1;
    local_1c0 = (ulong)((int)uVar15 >> 0x1f ^ uVar15);
    if (uVar4 != 3) {
      local_1c0 = uVar9;
    }
    local_150 = (ulong)uVar24;
    local_1d0 = p;
    if ((((n != 0.0) || (NAN(n))) && (local_1c8 = (ulong)(sf & 0x10), (sf & 0x10) != 0)) &&
       (((uint)local_1c0 < 0xe && (local_1c8 = (ulong)(uVar24 >> 6), 2 < local_1c8 - 0xf)))) {
      iVar14 = (int)rescale_e[local_1c8];
      dVar1 = n * rescale_n[local_1c8];
      if (uVar24 == 0) {
        dVar1 = dVar1 * 10000000000.0;
        iVar14 = iVar14 + -10;
      }
      lVar28 = (lua_Number)((long)dVar1 - 2);
      uVar24 = (uint)((ulong)lVar28 >> 0x20);
      local_138[0] = uVar24 & 0xfffff | 0x100000;
      local_1c8 = (ulong)local_138[0];
      uVar26 = (uVar24 >> 0x14 & 0x7ff) - 0x433;
      goto LAB_0011a091;
    }
    do {
      local_138[0] = uVar7 & 0xfffff;
      uVar26 = 0xfffffbee;
      if ((int)local_150 != 0) {
        local_138[0] = uVar7 & 0xfffff | 0x100000;
        uVar26 = (int)local_150 - 0x413;
      }
      uVar9 = 0;
      lVar28 = local_168;
      if (SUB84(local_168,0) == 0) {
        iVar14 = 0;
      }
      else {
        uVar26 = uVar26 - 0x20;
        iVar14 = 0;
LAB_0011a091:
        local_138[0] = local_138[0] << 3 | SUB84(lVar28,0) >> 0x1d;
        uVar5 = nd_mul2k(local_138,0,0x1d,SUB84(lVar28,0) & 0x1fffffff,sf);
        uVar9 = (ulong)uVar5;
      }
      uVar5 = (uint32_t)uVar9;
      if ((int)uVar26 < 0) {
        uVar4 = -uVar26;
        uVar24 = uVar4;
        if (uVar5 == 0) {
          local_1d8 = 0;
          if (local_138[0] != 0) {
            uVar15 = 0;
            if (local_138[0] != 0) {
              for (; (local_138[0] >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            if (uVar4 < uVar15 || uVar4 - uVar15 == 0) {
              local_138[0] = local_138[0] >> ((byte)uVar4 & 0x1f);
            }
            else {
              local_138[0] = local_138[0] >> ((byte)uVar15 & 0x1f);
              uVar24 = uVar4 - uVar15;
            }
            if (uVar15 < uVar4) goto LAB_0011a0fb;
          }
        }
        else {
LAB_0011a0fb:
          uVar4 = 0xffffffff;
          if (uVar24 < 0x13) {
            uVar15 = 0xffffffff;
          }
          else if ((sf & 0x30) == 0x20) {
            iVar18 = (int)((ulong)((long)(int)(uint)local_170 * -0x38e38e39) >> 0x20);
            uVar15 = ((iVar18 >> 1) - (iVar18 >> 0x1f)) + 0x3f;
          }
          else {
            iVar18 = 0x1f;
            if (local_138[uVar9] != 0) {
              for (; local_138[uVar9] >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar4 = (uint)local_170;
            if ((int)(uint)local_170 < 0) {
              uVar4 = local_154;
            }
            uVar15 = (int)((int)((double)(int)((uVar5 * 0x1d - uVar24) + iVar18) *
                                0.30102999566398114) - (uint)local_170) / 9 + 0x3e;
            uVar4 = (uVar5 - ((int)uVar4 >> 3)) + 0x3d;
          }
          uVar17 = 0;
          local_1d8 = 0;
          uVar25 = uVar9;
          do {
            uVar16 = (uint)uVar17;
            if (uVar24 < 9) {
              local_1d8 = uVar17;
              if (uVar24 != 0) {
                bVar12 = (byte)uVar24;
                uVar24 = 0;
                do {
                  uVar15 = (uint)uVar25;
                  uVar4 = local_138[uVar25];
                  local_138[uVar25] = (uVar4 >> (bVar12 & 0x1f)) + uVar24;
                  uVar24 = (uVar4 & ~(-1 << (bVar12 & 0x1f))) * (1000000000U >> (bVar12 & 0x1f));
                  uVar4 = uVar15 - 1 & 0x3f;
                  if (uVar15 == uVar16) {
                    uVar4 = uVar15;
                  }
                  uVar25 = (ulong)uVar4;
                } while (uVar15 != uVar16);
                if (uVar24 != 0) {
                  local_1d8 = (ulong)(uVar16 - 1 & 0x3f);
                  local_138[local_1d8] = uVar24;
                }
              }
              break;
            }
            uVar21 = 0;
            uVar11 = uVar25;
            do {
              uVar23 = (uint)uVar11;
              uVar20 = local_138[uVar11];
              local_138[uVar11] = (uVar20 >> 9) + uVar21;
              uVar20 = uVar20 & 0x1ff;
              uVar21 = uVar20 * 0x1dcd65;
              uVar27 = uVar23 - 1 & 0x3f;
              if (uVar23 == uVar16) {
                uVar27 = uVar23;
              }
              uVar11 = (ulong)uVar27;
            } while (uVar23 != uVar16);
            if ((uVar16 == uVar15) || (uVar16 == uVar4)) {
              if (local_138[uVar25] != 0) goto LAB_0011a27d;
              if ((uint)uVar25 != uVar16) goto LAB_0011a276;
              bVar13 = false;
              local_1d8 = uVar17;
            }
            else {
              if (uVar20 != 0) {
                uVar17 = (ulong)(uVar16 - 1 & 0x3f);
                local_138[uVar17] = uVar21;
              }
              if (local_138[uVar25] == 0) {
LAB_0011a276:
                uVar25 = (ulong)((uint)uVar25 - 1 & 0x3f);
                uVar4 = uVar4 - 1;
              }
LAB_0011a27d:
              uVar24 = uVar24 - 9;
              bVar13 = true;
            }
          } while (bVar13);
        }
        uVar25 = 0;
        if (uVar5 != 0) {
          uVar25 = (ulong)(uVar5 - (local_138[uVar9] == 0));
        }
      }
      else {
        local_1d8 = 0;
        uVar5 = nd_mul2k(local_138,uVar5,uVar26,0,sf);
        uVar25 = (ulong)uVar5;
      }
      uVar24 = (uint)local_1c0;
      if ((sf & 0x10) == 0) {
        if (uVar24 < (-(uint)local_1d8 & 0x3f) * 9) {
          uVar26 = nd_add_m10e(local_138,(uint32_t)uVar25,'\x05',~uVar24);
          uVar25 = (ulong)uVar26;
        }
        goto LAB_0011a9eb;
      }
      iVar18 = -1;
      if (((uint)local_1d8 != 0) && (local_138[uVar25] == 0)) {
        uVar25 = 0x40;
        do {
          uVar25 = (ulong)((int)uVar25 - 1);
        } while (local_138[uVar25] == 0);
        iVar18 = -0x241;
      }
      uVar4 = local_138[uVar25];
      iVar6 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar21 = (uint)(iVar6 * 0x4d) >> 8;
      uVar15 = ndigits_dec_threshold[(ulong)uVar21 + 1];
      uVar16 = uVar21 + (uVar15 < uVar4) + 1;
      uVar5 = (uint32_t)uVar25;
      iVar18 = uVar5 * 9 + iVar18 + uVar16;
      if (iVar14 == 0) {
LAB_0011a509:
        if (SBORROW4(uVar24 - iVar18,(-(uint)local_1d8 & 0x3f) * 9) !=
            (int)((uVar24 - iVar18) + (-(uint)local_1d8 & 0x3f) * -9) < 0) {
          uVar26 = nd_add_m10e(local_138,uVar5,'\x05',~uVar24 + iVar18);
          uVar25 = (ulong)uVar26;
          uVar20 = local_138[uVar26] | 1;
          iVar6 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          uVar20 = (uint)(iVar6 * 0x4d) >> 8;
          iVar18 = iVar18 + (uint)(uVar16 !=
                                  uVar20 + 1 +
                                  (uint)(ndigits_dec_threshold[(ulong)uVar20 + 1] <
                                        local_138[uVar26]));
        }
        uVar27 = iVar18 + iVar14;
        uVar20 = (uint)uVar25;
        if ((sf & 0x20) != 0) {
          if (((int)uVar27 <= (int)uVar24) && (-5 < (int)uVar27)) {
            if ((int)uVar27 < 0) {
              uVar25 = 0;
            }
            iVar6 = 0x10;
            local_1c0 = (ulong)(uVar24 - uVar27);
            goto LAB_0011a98d;
          }
          if ((((sf >> 0xc & 1) == 0) && (uVar24 != 0)) && (5 < uVar3)) {
            local_198 = (uint)(uVar15 < uVar4);
            uVar4 = (uVar20 - (uint)local_1d8 & 0x3f) * 9 + uVar21 + local_198;
            if (uVar24 < uVar4) {
              uVar4 = (uint)((ulong)((long)(int)((uVar24 - uVar16) + 9) * -0x38e38e39) >> 0x20);
              local_1d8 = (ulong)(((uVar4 >> 1) - ((int)uVar4 >> 0x1f)) + uVar20 & 0x3f);
              uVar4 = uVar24;
            }
            lj_strfmt_wuint9(local_179,local_138[local_1d8]);
            local_1c0 = 0;
            if (uVar4 != 0) {
              uVar9 = (ulong)((uVar4 - uVar16) + (uVar20 - (int)local_1d8 & 0x3f) * -9 + 10);
              do {
                uVar24 = (int)uVar9 - 1;
                uVar9 = (ulong)uVar24;
                if (local_179[uVar9] != '0') {
                  local_1c0 = (ulong)uVar4;
                  goto LAB_0011a598;
                }
                if (uVar24 == 0) {
                  if ((uint)local_1d8 == uVar20) break;
                  local_1d8 = (ulong)((uint)local_1d8 + 1 & 0x3f);
                  lj_strfmt_wuint9(local_179,local_138[local_1d8]);
                  uVar9 = 9;
                }
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
              local_1c0 = 0;
            }
          }
        }
LAB_0011a598:
        uVar24 = -uVar27;
        if (0 < (int)uVar27) {
          uVar24 = uVar27;
        }
        iVar14 = 0x1f;
        if ((uVar24 | 1) != 0) {
          for (; (uVar24 | 1) >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        uVar16 = (uint)(iVar14 * 0x4d) >> 8;
        uVar4 = ndigits_dec_threshold[uVar16 + 1];
        iVar14 = (int)local_1c0;
        bVar13 = (sf & 0x1000) != 0 || iVar14 != 0;
        uVar21 = (uint)(uVar24 < 10);
        uVar15 = local_190 + uVar21 + uVar16 + iVar14 + (uint)(uVar4 < uVar24) + (uint)bVar13 + 4;
        local_1c8 = (ulong)uVar15;
        if (local_1d0 == (char *)0x0) {
          uVar23 = uVar15;
          if (uVar15 < uVar3) {
            uVar23 = uVar3;
          }
          uVar22 = (local_160->p).ptr32;
          local_1d0 = (char *)(ulong)uVar22;
          if ((local_160->e).ptr32 - uVar22 < uVar23 + 5) {
            local_1d0 = lj_buf_more2(local_160,uVar23 + 5);
          }
        }
        uVar22 = (uint)(uVar4 < uVar24);
        uVar23 = (uint)bVar13;
        uVar4 = uVar3;
        if (((sf & 0x500) == 0) && (uVar4 = uVar3 - 1, uVar15 < uVar3)) {
          iVar18 = local_190 + iVar14 + uVar21 + uVar16 + uVar22;
          uVar9 = (ulong)(((uVar3 - iVar18) - uVar23) - 5);
          memset(local_1d0,0x20,uVar9 + 1);
          local_1d0 = local_1d0 + uVar9 + 1;
          uVar4 = iVar18 + uVar23 + 3;
        }
        if (!bVar2) {
          *local_1d0 = local_1a0;
          local_1d0 = local_1d0 + 1;
        }
        uVar3 = uVar4;
        if (((sf & 0x500) == 0x400) && (uVar3 = uVar4 - 1, uVar15 < uVar4)) {
          iVar18 = uVar21 + local_190 + iVar14 + uVar16 + uVar22;
          uVar9 = (ulong)(((uVar4 - iVar18) - uVar23) - 5);
          memset(local_1d0,0x30,uVar9 + 1);
          local_1d0 = local_1d0 + uVar9 + 1;
          uVar3 = iVar18 + uVar23 + 3;
        }
        pbVar29 = (byte *)(local_1d0 + 1);
        pcVar10 = lj_strfmt_wint((char *)pbVar29,local_138[uVar25]);
        *local_1d0 = local_1d0[1];
        if ((sf & 0x1000) != 0 || iVar14 != 0) {
          local_1d0[1] = '.';
          uVar4 = iVar14 + ((int)local_1d0 - (int)pcVar10) + 2;
          local_1c0 = (ulong)uVar4;
          if (0 < (int)uVar4) {
            uVar9 = uVar25;
            do {
              if (uVar20 == (uint)local_1d8) break;
              uVar20 = (int)uVar9 - 1U & 0x3f;
              uVar9 = (ulong)uVar20;
              pcVar10 = lj_strfmt_wuint9(pcVar10,local_138[uVar9]);
              iVar14 = (int)local_1c0;
              local_1c0 = (ulong)(iVar14 - 9);
            } while (9 < iVar14);
          }
          uVar4 = (uint)local_1c0;
          if ((sf & 0x1020) == 0x20) {
            pbVar29 = (byte *)(pcVar10 + (int)((int)uVar4 >> 0x1f & uVar4));
            do {
              pbVar30 = pbVar29;
              pbVar29 = pbVar30 + -1;
            } while (pbVar30[-1] == 0x30);
            if (pbVar30[-1] != 0x2e) {
              pbVar29 = pbVar30;
            }
          }
          else {
            if (0 < (int)uVar4) {
              memset(pcVar10,0x30,local_1c0);
              pcVar10 = pcVar10 + local_1c0;
              local_1c0 = 0;
            }
            pbVar29 = (byte *)(pcVar10 + (int)local_1c0);
          }
        }
        pbVar30 = pbVar29 + 2;
        *pbVar29 = ((sf >> 0xd & 1) == 0) << 5 | 0x45;
        pbVar29[1] = (char)((int)uVar27 >> 0x1f) * -2 + 0x2b;
        if (uVar24 < 10) {
          pbVar29[2] = 0x30;
          pbVar30 = pbVar29 + 3;
        }
        local_1d0 = lj_strfmt_wint((char *)pbVar30,uVar24);
        iVar6 = 0;
      }
      else {
        lVar8 = (long)(int)(uVar26 + ((~(ulong)lVar28 & 0xffffffffffffe) == 0));
        local_b4[0] = uVar4;
        uVar27 = uVar5 - 1 & 0x3f;
        local_b8 = local_138[uVar27];
        uVar9 = (ulong)(uVar5 + 0x3e & 0x3f);
        local_bc = local_138[uVar9];
        nd_add_m10e(local_138,uVar5,four_ulp_m_e[lVar8 * 2 + 0x8c],
                    (int)four_ulp_m_e[lVar8 * 2 + 0x8d]);
        uVar20 = (uVar24 + 1) - uVar16;
        if (uVar24 + 1 < uVar16) {
          puVar31 = local_b4;
          uVar20 = (uVar24 - uVar16) + 10;
          uVar9 = uVar25;
LAB_0011a495:
          lj_strfmt_wuint9(local_179,local_138[uVar9]);
          lj_strfmt_wuint9(local_141,*puVar31);
          uVar9 = (ulong)uVar20;
          iVar6 = bcmp(local_179,local_141,uVar9);
          bVar13 = true;
          if (iVar6 == 0) {
            bVar13 = local_141[uVar9] < '5' != local_179[uVar9] < '5';
          }
        }
        else {
          bVar13 = true;
          if (local_138[uVar25] == local_b4[0]) {
            puVar31 = &local_b8;
            if (uVar20 < 9) {
              uVar9 = (ulong)uVar27;
            }
            else {
              if (local_138[uVar27] != local_b8) goto LAB_0011a4ec;
              uVar20 = uVar20 - 9;
              puVar31 = &local_bc;
            }
            goto LAB_0011a495;
          }
        }
LAB_0011a4ec:
        iVar6 = 0xd;
        if (!bVar13) goto LAB_0011a509;
      }
LAB_0011a98d:
    } while (iVar6 == 0xd);
    if (iVar6 != 0) {
LAB_0011a9eb:
      if (((((sf & 0x10) != 0) && ((sf >> 0xc & 1) == 0)) && (uVar7 = (uint)local_1c0, uVar7 != 0))
         && (uVar3 != 0)) {
        if ((uint)local_1d8 == 0) {
          local_1d8._0_4_ = 0;
          local_1c0 = 0;
        }
        else {
          uVar24 = (0x40 - (uint)local_1d8) * 9;
          uVar9 = (ulong)uVar24;
          if (uVar7 < uVar24) {
            local_1d8 = (ulong)(0x40 - (uVar7 + 8) / 9);
            uVar9 = local_1c0;
          }
          lj_strfmt_wuint9(local_179,local_138[local_1d8]);
          uVar17 = 0;
          local_1c0 = uVar17;
          if ((int)uVar9 != 0) {
            uVar11 = (ulong)((int)uVar9 + (0x3f - (uint)local_1d8) * -9);
            do {
              uVar7 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar7;
              local_1c0 = uVar9;
              if (local_179[uVar11] != '0') break;
              if (uVar7 == 0) {
                local_1c0 = uVar17;
                if ((uint)local_1d8 == 0x3f) break;
                local_1d8 = (ulong)((uint)local_1d8 + 1);
                lj_strfmt_wuint9(local_179,local_138[local_1d8]);
                uVar11 = 9;
              }
              uVar7 = (int)uVar9 - 1;
              uVar9 = (ulong)uVar7;
              local_1c0 = uVar17;
            } while (uVar7 != 0);
          }
        }
      }
      iVar18 = (int)uVar25 * 9;
      uVar7 = local_138[uVar25];
      iVar14 = 0x1f;
      if ((uVar7 | 1) != 0) {
        for (; (uVar7 | 1) >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      uVar4 = (uint)(iVar14 * 0x4d) >> 8;
      uVar24 = ndigits_dec_threshold[(ulong)uVar4 + 1];
      iVar14 = (int)local_1c0;
      bVar13 = (sf & 0x1000) != 0 || iVar14 != 0;
      local_190 = local_190 + iVar14;
      local_1c8._0_4_ = local_190 + iVar18 + (uint)bVar13 + (uint)(uVar24 < uVar7) + uVar4 + 1;
      if (local_1d0 == (char *)0x0) {
        uVar15 = (uint)local_1c8;
        if ((uint)local_1c8 < uVar3) {
          uVar15 = uVar3;
        }
        uVar16 = (local_160->p).ptr32;
        local_1d0 = (char *)(ulong)uVar16;
        if ((local_160->e).ptr32 - uVar16 < uVar15 + 8) {
          local_1d0 = lj_buf_more2(local_160,uVar15 + 8);
        }
      }
      uVar15 = (uint)(uVar24 < uVar7);
      uVar7 = (uint)bVar13;
      uVar24 = uVar3;
      if ((sf & 0x500) == 0) {
        if ((uint)local_1c8 < uVar3) {
          uVar24 = local_190 + uVar7 + uVar4 + iVar18 + uVar15;
          uVar9 = (ulong)((uVar3 - uVar24) - 2);
          memset(local_1d0,0x20,uVar9 + 1);
          local_1d0 = local_1d0 + uVar9 + 1;
        }
        else {
          uVar24 = uVar3 - 1;
        }
      }
      if (!bVar2) {
        *local_1d0 = local_1a0;
        local_1d0 = local_1d0 + 1;
      }
      uVar3 = uVar24;
      if ((sf & 0x500) == 0x400) {
        if ((uint)local_1c8 < uVar24) {
          uVar3 = local_190 + uVar7 + uVar4 + iVar18 + uVar15;
          uVar9 = (ulong)((uVar24 - uVar3) - 2);
          memset(local_1d0,0x30,uVar9 + 1);
          local_1d0 = local_1d0 + uVar9 + 1;
        }
        else {
          uVar3 = uVar24 - 1;
        }
      }
      local_1d0 = lj_strfmt_wint(local_1d0,local_138[uVar25]);
      if ((int)uVar25 != 0) {
        do {
          local_1d0 = lj_strfmt_wuint9(local_1d0,local_138[uVar25 - 1]);
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      if ((sf & 0x1000) != 0 || iVar14 != 0) {
        *local_1d0 = '.';
        local_1d0 = local_1d0 + 1;
        if ((0 < iVar14) && ((uint)local_1d8 != 0)) {
          uVar9 = 0;
          do {
            uVar7 = (int)uVar9 - 1U & 0x3f;
            uVar9 = (ulong)uVar7;
            local_1d0 = lj_strfmt_wuint9(local_1d0,local_138[uVar9]);
            iVar14 = (int)local_1c0;
            local_1c0 = (ulong)(iVar14 - 9);
            if (iVar14 < 10) break;
          } while (uVar7 != (uint)local_1d8);
        }
        uVar7 = (uint)local_1c0;
        if ((sf & 0x1010) == 0x10) {
          pcVar10 = local_1d0 + (int)((int)uVar7 >> 0x1f & uVar7);
          do {
            local_1d0 = pcVar10;
            pcVar10 = local_1d0 + -1;
          } while (local_1d0[-1] == '0');
          if (local_1d0[-1] != '.') goto LAB_0011ad6b;
        }
        else {
          if (0 < (int)uVar7) {
            memset(local_1d0,0x30,local_1c0);
            local_1d0 = local_1d0 + local_1c0;
            uVar7 = 0;
          }
          pcVar10 = local_1d0 + (int)uVar7;
        }
        local_1d0 = pcVar10;
      }
    }
    goto LAB_0011ad6b;
  }
  pcVar10 = "0123456789ABCDEFPX";
  if ((sf >> 0xd & 1) == 0) {
    pcVar10 = "0123456789abcdefpx";
  }
  uVar7 = uVar7 >> 0x14 & 0x7ff;
  iVar14 = 6;
  if ((long)n < 0) {
    cVar19 = '-';
LAB_00119b58:
    bVar2 = false;
  }
  else {
    if ((sf >> 9 & 1) != 0) {
      cVar19 = '+';
      goto LAB_00119b58;
    }
    if ((sf >> 0xb & 1) != 0) {
      cVar19 = ' ';
      goto LAB_00119b58;
    }
    bVar2 = true;
    iVar14 = 5;
    cVar19 = '\0';
  }
  uVar25 = (ulong)n & 0xfffffffffffff;
  if (uVar7 == 0) {
    uVar7 = (uint)(uVar25 >> 0x20);
    if (uVar7 == 0 && uVar24 == 0) {
      uVar7 = 0;
    }
    else {
      iVar18 = 0x1f;
      if (uVar24 != 0) {
        for (; uVar24 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      iVar6 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      bVar13 = uVar25 >> 0x20 == 0;
      if (bVar13) {
        iVar6 = iVar18;
      }
      iVar6 = ((uint)bVar13 << 5 | 0x14) - iVar6;
      uVar7 = -iVar6 - 0x3fe;
      uVar25 = uVar25 << ((byte)iVar6 & 0x3f);
    }
  }
  else {
    uVar25 = uVar25 + 0x10000000000000;
    uVar7 = uVar7 - 0x3ff;
  }
  if (sf < 0x1000000) {
    uVar24 = (uint)uVar25;
    if (uVar24 == 0) {
      uVar24 = (uint)(uVar25 >> 0x20) | 0x100000;
      uVar4 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      iVar18 = 5;
    }
    else {
      uVar4 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      iVar18 = 0xd;
    }
    uVar9 = (ulong)(iVar18 - (uVar4 >> 2));
  }
  else if (uVar15 < 0xd) {
    uVar25 = uVar25 + (1L << ((char)uVar15 * -4 + 0x33U & 0x3f));
  }
  uVar24 = -uVar7;
  if (0 < (int)uVar7) {
    uVar24 = uVar7;
  }
  iVar18 = 0x1f;
  if ((uVar24 | 1) != 0) {
    for (; (uVar24 | 1) >> iVar18 == 0; iVar18 = iVar18 + -1) {
    }
  }
  uVar21 = (uint)(iVar18 * 0x4d) >> 8;
  uVar4 = ndigits_dec_threshold[uVar21 + 1];
  uVar15 = sf & 0x1000 | (uint)uVar9;
  uVar16 = (uint)(uVar15 != 0);
  local_1c8._0_4_ = iVar14 + uVar21 + 1 + (uint)uVar9 + uVar16 + (uint)(uVar4 < uVar24);
  local_170 = uVar9;
  if (p == (char *)0x0) {
    uVar20 = (uint)local_1c8;
    if ((uint)local_1c8 < uVar3) {
      uVar20 = uVar3;
    }
    uVar27 = (sb->p).ptr32;
    p = (char *)(ulong)uVar27;
    if ((sb->e).ptr32 - uVar27 < uVar20) {
      p = lj_buf_more2(sb,uVar20);
    }
  }
  uVar20 = (uint)(uVar4 < uVar24);
  iVar18 = (int)local_170;
  uVar4 = uVar3;
  if ((sf & 0x500) == 0) {
    if ((uint)local_1c8 < uVar3) {
      uVar4 = iVar18 + iVar14 + uVar21 + uVar16 + uVar20;
      uVar9 = (ulong)((uVar3 - uVar4) - 2);
      local_168 = (lua_Number)CONCAT44(local_168._4_4_,uVar15);
      memset(p,0x20,uVar9 + 1);
      iVar18 = (int)local_170;
      p = p + uVar9 + 1;
      uVar15 = local_168._0_4_;
    }
    else {
      uVar4 = uVar3 - 1;
    }
  }
  if (!bVar2) {
    *p = cVar19;
    p = p + 1;
  }
  *p = '0';
  __s = p + 2;
  p[1] = ((sf >> 0xd & 1) == 0) << 5 | 0x58;
  uVar3 = uVar4;
  if ((sf & 0x500) == 0x400) {
    if ((uint)local_1c8 < uVar4) {
      uVar3 = iVar14 + iVar18 + uVar21 + uVar16 + uVar20;
      uVar9 = (ulong)((uVar4 - uVar3) - 2);
      memset(__s,0x30,uVar9 + 1);
      __s = p + uVar9 + 3;
    }
    else {
      uVar3 = uVar4 - 1;
    }
  }
  pbVar29 = (byte *)(__s + 1);
  *__s = (char)(uVar25 >> 0x34) + '0';
  if (uVar15 != 0) {
    uVar4 = (uint)local_170;
    uVar9 = local_170 & 0xffffffff;
    __s[1] = '.';
    if (uVar4 < 0xd) {
      uVar25 = uVar25 >> ((char)local_170 * -4 + 0x34U & 0x3f);
    }
    else if (uVar4 != 0xd) {
      memset(__s + (uVar9 - (uVar4 - 0xe)) + 1,0x30,(ulong)(uVar4 - 0xd));
      uVar4 = 0xd;
    }
    pbVar29 = (byte *)(__s + uVar9 + 2);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      do {
        uVar17 = uVar9 - 1;
        __s[uVar9 + 1] = pcVar10[(uint)uVar25 & 0xf];
        uVar25 = uVar25 >> 4;
        uVar9 = uVar17;
      } while ((int)uVar17 != 0);
    }
  }
  *pbVar29 = ((sf >> 0xd & 1) == 0) << 5 | 0x50;
  pbVar29[1] = (char)((int)uVar7 >> 0x1f) * -2 + 0x2b;
  local_1d0 = lj_strfmt_wint((char *)(pbVar29 + 2),uVar24);
LAB_0011ad6b:
  if (((sf >> 8 & 1) != 0) && ((uint)local_1c8 < uVar3)) {
    memset(local_1d0,0x20,(ulong)(uVar3 + ~(uint)local_1c8) + 1);
    local_1d0 = local_1d0 + (ulong)(uVar3 + ~(uint)local_1c8) + 1;
  }
  return local_1d0;
}

Assistant:

static char *lj_strfmt_wfnum(SBuf *sb, SFormat sf, lua_Number n, char *p)
{
  MSize width = STRFMT_WIDTH(sf), prec = STRFMT_PREC(sf), len;
  TValue t;
  t.n = n;
  if (LJ_UNLIKELY((t.u32.hi << 1) >= 0xffe00000)) {
    /* Handle non-finite values uniformly for %a, %e, %f, %g. */
    int prefix = 0, ch = (sf & STRFMT_F_UPPER) ? 0x202020 : 0;
    if (((t.u32.hi & 0x000fffff) | t.u32.lo) != 0) {
      ch ^= ('n' << 16) | ('a' << 8) | 'n';
      if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    } else {
      ch ^= ('i' << 16) | ('n' << 8) | 'f';
      if ((t.u32.hi & 0x80000000)) prefix = '-';
      else if ((sf & STRFMT_F_PLUS)) prefix = '+';
      else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    }
    len = 3 + (prefix != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
    if (prefix) *p++ = prefix;
    *p++ = (char)(ch >> 16); *p++ = (char)(ch >> 8); *p++ = (char)ch;
  } else if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_A)) {
    /* %a */
    const char *hexdig = (sf & STRFMT_F_UPPER) ? "0123456789ABCDEFPX"
					       : "0123456789abcdefpx";
    int32_t e = (t.u32.hi >> 20) & 0x7ff;
    char prefix = 0, eprefix = '+';
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    t.u32.hi &= 0xfffff;
    if (e) {
      t.u32.hi |= 0x100000;
      e -= 1023;
    } else if (t.u32.lo | t.u32.hi) {
      /* Non-zero denormal - normalise it. */
      uint32_t shift = t.u32.hi ? 20-lj_fls(t.u32.hi) : 52-lj_fls(t.u32.lo);
      e = -1022 - shift;
      t.u64 <<= shift;
    }
    /* abs(n) == t.u64 * 2^(e - 52) */
    /* If n != 0, bit 52 of t.u64 is set, and is the highest set bit. */
    if ((int32_t)prec < 0) {
      /* Default precision: use smallest precision giving exact result. */
      prec = t.u32.lo ? 13-lj_ffs(t.u32.lo)/4 : 5-lj_ffs(t.u32.hi|0x100000)/4;
    } else if (prec < 13) {
      /* Precision is sufficiently low as to maybe require rounding. */
      t.u64 += (((uint64_t)1) << (51 - prec*4));
    }
    if (e < 0) {
      eprefix = '-';
      e = -e;
    }
    len = 5 + ndigits_dec((uint32_t)e) + prec + (prefix != 0)
	    + ((prec | (sf & STRFMT_F_ALT)) != 0);
    if (!p) p = lj_buf_more(sb, width > len ? width : len);
    if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
      while (width-- > len) *p++ = ' ';
    }
    if (prefix) *p++ = prefix;
    *p++ = '0';
    *p++ = hexdig[17]; /* x or X */
    if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
      while (width-- > len) *p++ = '0';
    }
    *p++ = '0' + (t.u32.hi >> 20); /* Usually '1', sometimes '0' or '2'. */
    if ((prec | (sf & STRFMT_F_ALT))) {
      /* Emit fractional part. */
      char *q = p + 1 + prec;
      *p = '.';
      if (prec < 13) t.u64 >>= (52 - prec*4);
      else while (prec > 13) p[prec--] = '0';
      while (prec) { p[prec--] = hexdig[t.u64 & 15]; t.u64 >>= 4; }
      p = q;
    }
    *p++ = hexdig[16]; /* p or P */
    *p++ = eprefix; /* + or - */
    p = lj_strfmt_wint(p, e);
  } else {
    /* %e or %f or %g - begin by converting n to "nd" format. */
    uint32_t nd[64];
    uint32_t ndhi = 0, ndlo, i;
    int32_t e = (t.u32.hi >> 20) & 0x7ff, ndebias = 0;
    char prefix = 0, *q;
    if (t.u32.hi & 0x80000000) prefix = '-';
    else if ((sf & STRFMT_F_PLUS)) prefix = '+';
    else if ((sf & STRFMT_F_SPACE)) prefix = ' ';
    prec += ((int32_t)prec >> 31) & 7; /* Default precision is 6. */
    if (STRFMT_FP(sf) == STRFMT_FP(STRFMT_T_FP_G)) {
      /* %g - decrement precision if non-zero (to make it like %e). */
      prec--;
      prec ^= (uint32_t)((int32_t)prec >> 31);
    }
    if ((sf & STRFMT_T_FP_E) && prec < 14 && n != 0) {
      /* Precision is sufficiently low that rescaling will probably work. */
      if ((ndebias = rescale_e[e >> 6])) {
	t.n = n * rescale_n[e >> 6];
	if (LJ_UNLIKELY(!e)) t.n *= 1e10, ndebias -= 10;
	t.u64 -= 2; /* Convert 2ulp below (later we convert 2ulp above). */
	nd[0] = 0x100000 | (t.u32.hi & 0xfffff);
	e = ((t.u32.hi >> 20) & 0x7ff) - 1075 - (ND_MUL2K_MAX_SHIFT < 29);
	goto load_t_lo; rescale_failed:
	t.n = n;
	e = (t.u32.hi >> 20) & 0x7ff;
	ndebias = ndhi = 0;
      }
    }
    nd[0] = t.u32.hi & 0xfffff;
    if (e == 0) e++; else nd[0] |= 0x100000;
    e -= 1043;
    if (t.u32.lo) {
      e -= 32 + (ND_MUL2K_MAX_SHIFT < 29); load_t_lo:
#if ND_MUL2K_MAX_SHIFT >= 29
      nd[0] = (nd[0] << 3) | (t.u32.lo >> 29);
      ndhi = nd_mul2k(nd, ndhi, 29, t.u32.lo & 0x1fffffff, sf);
#elif ND_MUL2K_MAX_SHIFT >= 11
      ndhi = nd_mul2k(nd, ndhi, 11, t.u32.lo >> 21, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo >> 10) & 0x7ff, sf);
      ndhi = nd_mul2k(nd, ndhi, 11, (t.u32.lo <<  1) & 0x7ff, sf);
#else
#error "ND_MUL2K_MAX_SHIFT too small"
#endif
    }
    if (e >= 0) {
      ndhi = nd_mul2k(nd, ndhi, (uint32_t)e, 0, sf);
      ndlo = 0;
    } else {
      ndlo = nd_div2k(nd, ndhi, (uint32_t)-e, sf);
      if (ndhi && !nd[ndhi]) ndhi--;
    }
    /* abs(n) == nd * 10^ndebias (for slightly loose interpretation of ==) */
    if ((sf & STRFMT_T_FP_E)) {
      /* %e or %g - assume %e and start by calculating nd's exponent (nde). */
      char eprefix = '+';
      int32_t nde = -1;
      MSize hilen;
      if (ndlo && !nd[ndhi]) {
	ndhi = 64; do {} while (!nd[--ndhi]);
	nde -= 64 * 9;
      }
      hilen = ndigits_dec(nd[ndhi]);
      nde += ndhi * 9 + hilen;
      if (ndebias) {
	/*
	** Rescaling was performed, but this introduced some error, and might
	** have pushed us across a rounding boundary. We check whether this
	** error affected the result by introducing even more error (2ulp in
	** either direction), and seeing whether a rounding boundary was
	** crossed. Having already converted the -2ulp case, we save off its
	** most significant digits, convert the +2ulp case, and compare them.
	*/
	int32_t eidx = e + 70 + (ND_MUL2K_MAX_SHIFT < 29)
			 + (t.u32.lo >= 0xfffffffe && !(~t.u32.hi << 12));
	const int8_t *m_e = four_ulp_m_e + eidx * 2;
	lj_assertG_(G(sbufL(sb)), 0 <= eidx && eidx < 128, "bad eidx %d", eidx);
	nd[33] = nd[ndhi];
	nd[32] = nd[(ndhi - 1) & 0x3f];
	nd[31] = nd[(ndhi - 2) & 0x3f];
	nd_add_m10e(nd, ndhi, (uint8_t)*m_e, m_e[1]);
	if (LJ_UNLIKELY(!nd_similar(nd, ndhi, nd + 33, hilen, prec + 1))) {
	  goto rescale_failed;
	}
      }
      if ((int32_t)(prec - nde) < (0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, nde - prec - 1);
	nde += (hilen != ndigits_dec(nd[ndhi]));
      }
      nde += ndebias;
      if ((sf & STRFMT_T_FP_F)) {
	/* %g */
	if ((int32_t)prec >= nde && nde >= -4) {
	  if (nde < 0) ndhi = 0;
	  prec -= nde;
	  goto g_format_like_f;
	} else if (!(sf & STRFMT_F_ALT) && prec && width > 5) {
	  /* Decrease precision in order to strip trailing zeroes. */
	  char tail[9];
	  uint32_t maxprec = hilen - 1 + ((ndhi - ndlo) & 0x3f) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = (ndhi - (((int32_t)(prec - hilen) + 9) / 9)) & 0x3f;
	  i = prec - hilen - (((ndhi - ndlo) & 0x3f) * 9) + 10;
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == ndhi) { prec = 0; break; }
	      ndlo = (ndlo + 1) & 0x3f;
	      lj_strfmt_wuint9(tail, nd[ndlo]);
	      i = 9;
	    }
	  }
	}
      }
      if (nde < 0) {
	/* Make nde non-negative. */
	eprefix = '-';
	nde = -nde;
      }
      len = 3 + prec + (prefix != 0) + ndigits_dec((uint32_t)nde) + (nde < 10)
	      + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 5);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      q = lj_strfmt_wint(p + 1, nd[ndhi]);
      p[0] = p[1]; /* Put leading digit in the correct place. */
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	p[1] = '.'; p += 2;
	prec -= (MSize)(q - p); p = q; /* Account for digits already emitted. */
	/* Then emit chunks of 9 digits (this may emit 8 digits too many). */
	for (i = ndhi; (int32_t)prec > 0 && i != ndlo; prec -= 9) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	}
	if ((sf & STRFMT_T_FP_F) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %e (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      } else {
	p++;
      }
      *p++ = (sf & STRFMT_F_UPPER) ? 'E' : 'e';
      *p++ = eprefix; /* + or - */
      if (nde < 10) *p++ = '0'; /* Always at least two digits of exponent. */
      p = lj_strfmt_wint(p, nde);
    } else {
      /* %f (or, shortly, %g in %f style) */
      if (prec < (MSize)(0x3f & -(int32_t)ndlo) * 9) {
	/* Precision is sufficiently low as to maybe require rounding. */
	ndhi = nd_add_m10e(nd, ndhi, 5, 0 - prec - 1);
      }
      g_format_like_f:
      if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT) && prec && width) {
	/* Decrease precision in order to strip trailing zeroes. */
	if (ndlo) {
	  /* nd has a fractional part; we need to look at its digits. */
	  char tail[9];
	  uint32_t maxprec = (64 - ndlo) * 9;
	  if (prec >= maxprec) prec = maxprec;
	  else ndlo = 64 - (prec + 8) / 9;
	  i = prec - ((63 - ndlo) * 9);
	  lj_strfmt_wuint9(tail, nd[ndlo]);
	  while (prec && tail[--i] == '0') {
	    prec--;
	    if (!i) {
	      if (ndlo == 63) { prec = 0; break; }
	      lj_strfmt_wuint9(tail, nd[++ndlo]);
	      i = 9;
	    }
	  }
	} else {
	  /* nd has no fractional part, so precision goes straight to zero. */
	  prec = 0;
	}
      }
      len = ndhi * 9 + ndigits_dec(nd[ndhi]) + prec + (prefix != 0)
		     + ((prec | (sf & STRFMT_F_ALT)) != 0);
      if (!p) p = lj_buf_more(sb, (width > len ? width : len) + 8);
      if (!(sf & (STRFMT_F_LEFT | STRFMT_F_ZERO))) {
	while (width-- > len) *p++ = ' ';
      }
      if (prefix) *p++ = prefix;
      if ((sf & (STRFMT_F_LEFT | STRFMT_F_ZERO)) == STRFMT_F_ZERO) {
	while (width-- > len) *p++ = '0';
      }
      /* Emit integer part. */
      p = lj_strfmt_wint(p, nd[ndhi]);
      i = ndhi;
      while (i) p = lj_strfmt_wuint9(p, nd[--i]);
      if ((prec | (sf & STRFMT_F_ALT))) {
	/* Emit fractional part. */
	*p++ = '.';
	/* Emit chunks of 9 digits (this may emit 8 digits too many). */
	while ((int32_t)prec > 0 && i != ndlo) {
	  i = (i - 1) & 0x3f;
	  p = lj_strfmt_wuint9(p, nd[i]);
	  prec -= 9;
	}
	if ((sf & STRFMT_T_FP_E) && !(sf & STRFMT_F_ALT)) {
	  /* %g (and not %#g) - strip trailing zeroes. */
	  p += (int32_t)prec & ((int32_t)prec >> 31);
	  while (p[-1] == '0') p--;
	  if (p[-1] == '.') p--;
	} else {
	  /* %f (or %#g) - emit trailing zeroes. */
	  while ((int32_t)prec > 0) { *p++ = '0'; prec--; }
	  p += (int32_t)prec;
	}
      }
    }
  }
  if ((sf & STRFMT_F_LEFT)) while (width-- > len) *p++ = ' ';
  return p;
}